

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O0

void __thiscall
TPZMHMeshControl::DefinePartitionbyCoarseIndices(TPZMHMeshControl *this,TPZVec<long> *coarseindices)

{
  long lVar1;
  int64_t iVar2;
  int64_t iVar3;
  long *plVar4;
  TPZGeoEl *pTVar5;
  mapped_type_conflict *pmVar6;
  TPZVec<long> *in_RSI;
  long *in_RDI;
  int64_t index;
  TPZGeoEl *father;
  int domain;
  TPZGeoEl *gel_1;
  int64_t el_2;
  TPZGeoEl *gel;
  int64_t el_1;
  int64_t el;
  int64_t nel;
  int64_t ncoarse;
  long in_stack_ffffffffffffff68;
  TPZGeoMesh *in_stack_ffffffffffffff70;
  int64_t in_stack_ffffffffffffff98;
  TPZManVector<long,_10> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  *in_stack_ffffffffffffffb0;
  int64_t local_48;
  long local_30;
  int64_t local_28;
  
  iVar2 = TPZVec<long>::size(in_RSI);
  TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 1));
  iVar3 = TPZGeoMesh::NElements((TPZGeoMesh *)0x1e090ff);
  TPZManVector<long,_10>::Resize(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  for (local_28 = 0; local_28 < iVar3; local_28 = local_28 + 1) {
    plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x19),local_28);
    *plVar4 = -1;
  }
  for (local_30 = 0; local_30 < iVar2; local_30 = local_30 + 1) {
    plVar4 = TPZVec<long>::operator[](in_RSI,local_30);
    lVar1 = *plVar4;
    plVar4 = TPZVec<long>::operator[](in_RSI,local_30);
    plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x19),*plVar4);
    *plVar4 = lVar1;
    TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 1));
    TPZVec<long>::operator[](in_RSI,local_30);
    pTVar5 = TPZGeoMesh::Element(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (pTVar5 != (TPZGeoEl *)0x0) {
      in_stack_ffffffffffffff70 = (TPZGeoMesh *)(in_RDI + 0x27);
      TPZGeoEl::Index(pTVar5);
      pmVar6 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
               ::operator[](in_stack_ffffffffffffffb0,
                            (key_type_conflict1 *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      *pmVar6 = -1;
    }
  }
  local_48 = 0;
  do {
    if (iVar3 <= local_48) {
      (**(code **)(*in_RDI + 0x28))();
      return;
    }
    TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 1));
    pTVar5 = TPZGeoMesh::Element(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if ((pTVar5 != (TPZGeoEl *)0x0) &&
       (plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x19),local_48), *plVar4 == -1))
    {
      pTVar5 = TPZGeoEl::Father((TPZGeoEl *)in_stack_ffffffffffffff70);
      while (pTVar5 != (TPZGeoEl *)0x0) {
        iVar2 = TPZGeoEl::Index(pTVar5);
        plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x19),iVar2);
        if (*plVar4 != -1) {
          plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x19),iVar2);
          in_stack_ffffffffffffff68 = *plVar4;
          plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x19),local_48);
          *plVar4 = in_stack_ffffffffffffff68;
          break;
        }
        pTVar5 = TPZGeoEl::Father((TPZGeoEl *)in_stack_ffffffffffffff70);
      }
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

void TPZMHMeshControl::DefinePartitionbyCoarseIndices(TPZVec<int64_t> &coarseindices)
{
    int64_t ncoarse = coarseindices.size();
    int64_t nel = fGMesh->NElements();
    fGeoToMHMDomain.Resize(nel);
    for (int64_t el=0; el<nel; el++) {
        fGeoToMHMDomain[el] = -1;
    }
    for (int64_t el=0; el<ncoarse; el++) {
        fGeoToMHMDomain[coarseindices[el]] = coarseindices[el];
        TPZGeoEl *gel = fGMesh->Element(coarseindices[el]);
        if (gel) {
            fMHMtoSubCMesh[gel->Index()] = -1;
        }
    }
    // set the MHM domain index for all elements
    // look for a father element that has a MHM domain index
    // adopt the domain index of the ancester
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = fGMesh->Element(el);
        if (!gel || fGeoToMHMDomain[el] != -1) {
            continue;
        }
        int domain = -1;
        TPZGeoEl *father = gel->Father();
        while (father) {
            int64_t index = father->Index();
            if (fGeoToMHMDomain[index] != -1) {
                fGeoToMHMDomain[el] = fGeoToMHMDomain[index];
                break;
            }
            father = father->Father();
        }
    }
    CreateSkeletonElements();
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "Subdomain indices " << fGeoToMHMDomain << std::endl;
        sout << "Recognized domains ";
        for (auto it = fMHMtoSubCMesh.begin(); it != fMHMtoSubCMesh.end(); it++) {
            sout << it->first << ' ';
        }
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
}